

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

TimeInfo * __thiscall
absl::lts_20240722::TimeZone::At(TimeInfo *__return_storage_ptr__,TimeZone *this,CivilSecond ct)

{
  bool *normalized;
  Duration DVar1;
  civil_lookup cl;
  civil_second cs;
  CivilKind local_48 [2];
  time_point<cctz::seconds> local_40;
  time_point<cctz::seconds> local_38;
  time_point<cctz::seconds> local_30;
  civil_second local_28;
  
  local_28.f_.y = ct.f_.y;
  local_28.f_._8_4_ = ct.f_._8_4_;
  normalized = (bool *)(ct.f_._8_8_ >> 0x20);
  local_28.f_.ss = ct.f_.ss;
  absl::lts_20240722::time_internal::cctz::time_zone::lookup((civil_time *)local_48);
  if (local_48[0] < (REPEATED|SKIPPED)) {
    __return_storage_ptr__->kind = local_48[0];
  }
  DVar1 = (Duration)anon_unknown_8::MakeTimeWithOverflow(&local_40,&local_28,&this->cz_,normalized);
  (__return_storage_ptr__->pre).rep_ = DVar1;
  DVar1 = (Duration)anon_unknown_8::MakeTimeWithOverflow(&local_38,&local_28,&this->cz_,normalized);
  (__return_storage_ptr__->trans).rep_ = DVar1;
  DVar1 = (Duration)anon_unknown_8::MakeTimeWithOverflow(&local_30,&local_28,&this->cz_,normalized);
  (__return_storage_ptr__->post).rep_ = DVar1;
  return __return_storage_ptr__;
}

Assistant:

absl::TimeZone::TimeInfo TimeZone::At(CivilSecond ct) const {
  const cctz::civil_second cs(ct);
  const auto cl = cz_.lookup(cs);

  TimeZone::TimeInfo ti;
  switch (cl.kind) {
    case cctz::time_zone::civil_lookup::UNIQUE:
      ti.kind = TimeZone::TimeInfo::UNIQUE;
      break;
    case cctz::time_zone::civil_lookup::SKIPPED:
      ti.kind = TimeZone::TimeInfo::SKIPPED;
      break;
    case cctz::time_zone::civil_lookup::REPEATED:
      ti.kind = TimeZone::TimeInfo::REPEATED;
      break;
  }
  ti.pre = MakeTimeWithOverflow(cl.pre, cs, cz_);
  ti.trans = MakeTimeWithOverflow(cl.trans, cs, cz_);
  ti.post = MakeTimeWithOverflow(cl.post, cs, cz_);
  return ti;
}